

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int formatf(void *userp,_func_int_uchar_void_ptr *stream,char *format,__va_list_tag *ap_save)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 uVar3;
  int iVar4;
  uchar *puVar5;
  size_t *psVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  bool bVar10;
  int local_1a88;
  double local_1a68;
  double val;
  int maxprec;
  size_t dlen;
  size_t sStack_1a48;
  int len_1;
  size_t left;
  char *fptr;
  char formatbuf [32];
  uchar *local_1a10;
  char *point;
  size_t len;
  char *str_1;
  char *str;
  char *pcStack_19e8;
  uint flags;
  size_t outlen;
  char *w;
  longlong signed_num;
  unsigned_long_long num;
  unsigned_long base;
  uint uStack_19b8;
  _Bool is_neg;
  int prec;
  int width;
  _Bool is_alt;
  va_input *iptr;
  outsegment *optr;
  char *workend;
  char work [328];
  undefined1 local_1848 [8];
  va_input input [128];
  outsegment output [128];
  int icount;
  int ocount;
  int i;
  int done;
  char *digits;
  __va_list_tag *ap_save_local;
  char *format_local;
  _func_int_uchar_void_ptr *stream_local;
  void *userp_local;
  
  _i = "0123456789abcdefghijklmnopqrstuvwxyz";
  ocount = 0;
  output[0x7f].outlen._4_4_ = 0;
  output[0x7f].outlen._0_4_ = 0;
  puVar5 = (uchar *)(work + 0x13c);
  iVar4 = parsefmt(format,(outsegment *)&input[0x7f].val,(va_input *)local_1848,
                   (int *)((long)&output[0x7f].outlen + 4),(int *)&output[0x7f].outlen,ap_save);
  if (iVar4 == 0) {
    for (icount = 0; icount < output[0x7f].outlen._4_4_; icount = icount + 1) {
      lVar9 = (long)icount;
      psVar6 = &output[lVar9 + -1].outlen;
      pcStack_19e8 = output[lVar9].start;
      str._4_4_ = output[lVar9].width;
      if (pcStack_19e8 != (char *)0x0) {
        str_1 = *(char **)&output[lVar9].flags;
        while( true ) {
          bVar10 = false;
          if (pcStack_19e8 != (char *)0x0) {
            bVar10 = *str_1 != '\0';
          }
          if (!bVar10) break;
          iVar4 = (*stream)(*str_1,userp);
          if (iVar4 != 0) {
            return ocount;
          }
          ocount = ocount + 1;
          pcStack_19e8 = pcStack_19e8 + -1;
          str_1 = str_1 + 1;
        }
        if ((output[lVar9].width & 0x100000U) == 0) goto LAB_0016606c;
        goto switchD_001661d2_default;
      }
LAB_0016606c:
      if ((str._4_4_ & 0x4000) == 0) {
        uStack_19b8 = (uint)*psVar6;
      }
      else {
        uStack_19b8 = (uint)*(undefined8 *)(input + (int)*psVar6);
        if ((int)uStack_19b8 < 0) {
          if (uStack_19b8 == 0x80000000) {
            uStack_19b8 = 0x7fffffff;
          }
          else {
            uStack_19b8 = -uStack_19b8;
          }
          str._4_4_ = str._4_4_ & 0xfffffeff | 4;
        }
      }
      if ((str._4_4_ & 0x10000) == 0) {
        if ((str._4_4_ & 0x8000) == 0) {
          base._4_4_ = 0xffffffff;
        }
        else {
          base._4_4_ = *(uint *)((long)&output[lVar9 + -1].outlen + 4);
        }
      }
      else {
        base._4_4_ = (uint)*(undefined8 *)(input + *(int *)((long)&output[lVar9 + -1].outlen + 4));
        if ((int)base._4_4_ < 0) {
          base._4_4_ = 0xffffffff;
        }
      }
      prec._3_1_ = (char)((str._4_4_ & 8) >> 3);
      uVar7 = (ulong)(uint)output[lVar9].precision;
      switch(*(undefined4 *)&input[uVar7 - 1].val) {
      case 0:
        len = *(size_t *)(input + uVar7);
        if ((char *)len == (char *)0x0) {
          if ((base._4_4_ == 0xffffffff) || (4 < (int)base._4_4_)) {
            len = (size_t)formatf::nilstr;
            point = (char *)0x5;
            str._4_4_ = str._4_4_ & 0xfffffff7;
          }
          else {
            len = (long)"n,a=%s,\x01host=%s\x01port=%ld\x01auth=Bearer %s\x01\x01" + 0x29;
            point = (char *)0x0;
          }
        }
        else if (base._4_4_ == 0xffffffff) {
          if (*(char *)len == '\0') {
            point = (char *)0x0;
          }
          else {
            point = (char *)strlen((char *)len);
          }
        }
        else {
          point = (char *)(long)(int)base._4_4_;
        }
        if (point < (char *)0x80000000) {
          local_1a88 = (int)point;
        }
        else {
          local_1a88 = 0x7fffffff;
        }
        uStack_19b8 = uStack_19b8 - local_1a88;
        if ((str._4_4_ & 8) != 0) {
          iVar4 = (*stream)('\"',userp);
          if (iVar4 != 0) {
            return ocount;
          }
          ocount = ocount + 1;
        }
        if ((str._4_4_ & 4) == 0) {
          while (iVar4 = uStack_19b8 + -1, bVar10 = 0 < (int)uStack_19b8, uStack_19b8 = iVar4,
                bVar10) {
            iVar4 = (*stream)(' ',userp);
            if (iVar4 != 0) {
              return ocount;
            }
            ocount = ocount + 1;
          }
        }
        while( true ) {
          bVar10 = false;
          if (point != (char *)0x0) {
            bVar10 = *(char *)len != '\0';
          }
          if (!bVar10) break;
          iVar4 = (*stream)(*(uchar *)len,userp);
          if (iVar4 != 0) {
            return ocount;
          }
          ocount = ocount + 1;
          point = point + -1;
          len = len + 1;
        }
        if ((str._4_4_ & 4) != 0) {
          while (0 < (int)uStack_19b8) {
            iVar4 = (*stream)(' ',userp);
            if (iVar4 != 0) {
              return ocount;
            }
            ocount = ocount + 1;
            uStack_19b8 = uStack_19b8 + -1;
          }
        }
        if ((str._4_4_ & 8) != 0) {
          iVar4 = (*stream)('\"',userp);
          if (iVar4 != 0) {
            return ocount;
          }
          ocount = ocount + 1;
        }
        break;
      case 1:
        if (*(long *)(input + uVar7) == 0) {
          uStack_19b8 = uStack_19b8 - 5;
          if ((str._4_4_ & 4) != 0) {
            while (iVar4 = uStack_19b8 + -1, bVar10 = 0 < (int)uStack_19b8, uStack_19b8 = iVar4,
                  bVar10) {
              iVar4 = (*stream)(' ',userp);
              if (iVar4 != 0) {
                return ocount;
              }
              ocount = ocount + 1;
            }
          }
          for (local_1a10 = "(nil)"; *local_1a10 != '\0'; local_1a10 = local_1a10 + 1) {
            iVar4 = (*stream)(*local_1a10,userp);
            if (iVar4 != 0) {
              return ocount;
            }
            ocount = ocount + 1;
          }
          if ((str._4_4_ & 4) == 0) {
            while (0 < (int)uStack_19b8) {
              iVar4 = (*stream)(' ',userp);
              if (iVar4 != 0) {
                return ocount;
              }
              ocount = ocount + 1;
              uStack_19b8 = uStack_19b8 + -1;
            }
          }
          break;
        }
        num = 0x10;
        _i = "0123456789abcdefghijklmnopqrstuvwxyz";
        if ((str._4_4_ & 0x1000) != 0) {
          _i = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
        }
        prec._3_1_ = '\x01';
        signed_num = *(longlong *)(input + uVar7);
        bVar10 = false;
        goto LAB_001663ff;
      case 2:
        if ((str._4_4_ & 0x40) == 0) {
          if ((str._4_4_ & 0x20) == 0) {
            if ((str._4_4_ & 0x10) == 0) {
              **(int **)(input + uVar7) = ocount;
            }
            else {
              **(undefined2 **)(input + uVar7) = (short)ocount;
            }
          }
          else {
            **(long **)(input + uVar7) = (long)ocount;
          }
        }
        else {
          **(long **)(input + uVar7) = (long)ocount;
        }
        break;
      case 6:
      case 7:
      case 8:
        str._4_4_ = str._4_4_ | 0x200;
      case 3:
      case 4:
      case 5:
        signed_num = *(longlong *)(input + uVar7);
        if ((str._4_4_ & 0x20000) == 0) {
          if ((str._4_4_ & 0x400) == 0) {
            if ((str._4_4_ & 0x800) == 0) {
              if ((str._4_4_ & 0x200) == 0) {
                bVar10 = *(long *)(input + uVar7) < 0;
                if (bVar10) {
                  signed_num = 1 - (*(long *)(input + uVar7) + 1);
                }
              }
              else {
                bVar10 = false;
              }
              num = 10;
            }
            else {
              _i = "0123456789abcdefghijklmnopqrstuvwxyz";
              if ((str._4_4_ & 0x1000) != 0) {
                _i = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
              }
              num = 0x10;
              bVar10 = false;
            }
          }
          else {
            num = 8;
            bVar10 = false;
          }
LAB_001663ff:
          if (base._4_4_ == 0xffffffff) {
            base._4_4_ = 1;
          }
          outlen = (size_t)puVar5;
          if (num == 10) {
            for (; signed_num != 0; signed_num = (ulong)signed_num / 10) {
              auVar2._8_8_ = 0;
              auVar2._0_8_ = signed_num;
              *(char *)outlen = SUB161(auVar2 % ZEXT816(10),0) + '0';
              outlen = outlen - 1;
            }
          }
          else {
            for (; signed_num != 0; signed_num = (ulong)signed_num / num) {
              *(char *)outlen = _i[(ulong)signed_num % num];
              outlen = outlen - 1;
            }
          }
          uStack_19b8 = uStack_19b8 - ((int)puVar5 - (int)outlen);
          base._4_4_ = base._4_4_ - ((int)puVar5 - (int)outlen);
          if (((prec._3_1_ != '\0') && (num == 8)) && ((int)base._4_4_ < 1)) {
            *(undefined1 *)outlen = 0x30;
            uStack_19b8 = uStack_19b8 + -1;
            outlen = outlen - 1;
          }
          if (0 < (int)base._4_4_) {
            uStack_19b8 = uStack_19b8 - base._4_4_;
            while (0 < (int)base._4_4_ && &workend <= outlen) {
              *(undefined1 *)outlen = 0x30;
              outlen = outlen - 1;
              base._4_4_ = base._4_4_ + -1;
            }
          }
          if ((prec._3_1_ != '\0') && (num == 0x10)) {
            uStack_19b8 = uStack_19b8 + -2;
          }
          if (((bVar10) || ((str._4_4_ & 2) != 0)) || ((str._4_4_ & 1) != 0)) {
            uStack_19b8 = uStack_19b8 + -1;
          }
          if (((str._4_4_ & 4) == 0) && ((str._4_4_ & 0x100) == 0)) {
            while (iVar4 = uStack_19b8 + -1, bVar1 = 0 < (int)uStack_19b8, uStack_19b8 = iVar4,
                  bVar1) {
              iVar4 = (*stream)(' ',userp);
              if (iVar4 != 0) {
                return ocount;
              }
              ocount = ocount + 1;
            }
          }
          if (bVar10) {
            iVar4 = (*stream)('-',userp);
            if (iVar4 != 0) {
              return ocount;
            }
            ocount = ocount + 1;
          }
          else if ((str._4_4_ & 2) == 0) {
            if ((str._4_4_ & 1) != 0) {
              iVar4 = (*stream)(' ',userp);
              if (iVar4 != 0) {
                return ocount;
              }
              ocount = ocount + 1;
            }
          }
          else {
            iVar4 = (*stream)('+',userp);
            if (iVar4 != 0) {
              return ocount;
            }
            ocount = ocount + 1;
          }
          if ((prec._3_1_ != '\0') && (num == 0x10)) {
            iVar4 = (*stream)('0',userp);
            if (iVar4 != 0) {
              return ocount;
            }
            if ((str._4_4_ & 0x1000) == 0) {
              iVar4 = (*stream)('x',userp);
            }
            else {
              iVar4 = (*stream)('X',userp);
            }
            if (iVar4 != 0) {
              return ocount + 1;
            }
            ocount = ocount + 2;
          }
          if (((str._4_4_ & 4) == 0) && ((str._4_4_ & 0x100) != 0)) {
            while (iVar4 = uStack_19b8 + -1, bVar10 = 0 < (int)uStack_19b8, uStack_19b8 = iVar4,
                  bVar10) {
              iVar4 = (*stream)('0',userp);
              if (iVar4 != 0) {
                return ocount;
              }
              ocount = ocount + 1;
            }
          }
          while (outlen = outlen + 1, outlen <= puVar5) {
            iVar4 = (*stream)(*(uchar *)outlen,userp);
            if (iVar4 != 0) {
              return ocount;
            }
            ocount = ocount + 1;
          }
          if ((str._4_4_ & 4) != 0) {
            while (0 < (int)uStack_19b8) {
              iVar4 = (*stream)(' ',userp);
              if (iVar4 != 0) {
                return ocount;
              }
              ocount = ocount + 1;
              uStack_19b8 = uStack_19b8 + -1;
            }
          }
        }
        else {
          if ((str._4_4_ & 4) == 0) {
            while (uStack_19b8 = uStack_19b8 - 1, 0 < (int)uStack_19b8) {
              iVar4 = (*stream)(' ',userp);
              if (iVar4 != 0) {
                return ocount;
              }
              ocount = ocount + 1;
            }
          }
          iVar4 = (*stream)((uchar)signed_num,userp);
          if (iVar4 != 0) {
            return ocount;
          }
          ocount = ocount + 1;
          if ((str._4_4_ & 4) != 0) {
            while (uStack_19b8 = uStack_19b8 - 1, 0 < (int)uStack_19b8) {
              iVar4 = (*stream)(' ',userp);
              if (iVar4 != 0) {
                return ocount;
              }
              ocount = ocount + 1;
            }
          }
        }
        break;
      case 9:
        fptr = (char *)0x25;
        formatbuf[0] = '\0';
        formatbuf[1] = '\0';
        formatbuf[2] = '\0';
        formatbuf[3] = '\0';
        formatbuf[4] = '\0';
        formatbuf[5] = '\0';
        formatbuf[6] = '\0';
        formatbuf[7] = '\0';
        formatbuf[8] = '\0';
        formatbuf[9] = '\0';
        formatbuf[10] = '\0';
        formatbuf[0xb] = '\0';
        formatbuf[0xc] = '\0';
        formatbuf[0xd] = '\0';
        formatbuf[0xe] = '\0';
        formatbuf[0xf] = '\0';
        formatbuf[0x10] = '\0';
        formatbuf[0x11] = '\0';
        formatbuf[0x12] = '\0';
        formatbuf[0x13] = '\0';
        formatbuf[0x14] = '\0';
        formatbuf[0x15] = '\0';
        formatbuf[0x16] = '\0';
        formatbuf[0x17] = '\0';
        left = (long)&fptr + 1;
        sVar8 = strlen((char *)&fptr);
        sStack_1a48 = 0x20 - sVar8;
        if ((str._4_4_ & 0x2000) != 0) {
          uStack_19b8 = (uint)*psVar6;
        }
        if ((str._4_4_ & 0x8000) != 0) {
          base._4_4_ = *(uint *)((long)&output[lVar9 + -1].outlen + 4);
        }
        if ((str._4_4_ & 4) != 0) {
          left = (long)&fptr + 2;
          fptr._1_1_ = 0x2d;
        }
        if ((str._4_4_ & 2) != 0) {
          *(undefined1 *)left = 0x2b;
          left = left + 1;
        }
        if ((str._4_4_ & 1) != 0) {
          *(undefined1 *)left = 0x20;
          left = left + 1;
        }
        if ((str._4_4_ & 8) != 0) {
          *(undefined1 *)left = 0x23;
          left = left + 1;
        }
        *(undefined1 *)left = 0;
        if (-1 < (int)uStack_19b8) {
          if (0x145 < (int)uStack_19b8) {
            uStack_19b8 = 0x145;
          }
          iVar4 = curl_msnprintf((char *)left,sStack_1a48,"%d",(ulong)uStack_19b8);
          left = (long)iVar4 + left;
          sStack_1a48 = sStack_1a48 - (long)iVar4;
        }
        if (-1 < (int)base._4_4_) {
          val._4_4_ = 0x145;
          local_1a68 = *(double *)(input + uVar7);
          if (0x145 < (int)base._4_4_) {
            base._4_4_ = 0x144;
          }
          if ((0 < (int)uStack_19b8) && ((int)base._4_4_ <= (int)uStack_19b8)) {
            val._4_4_ = 0x145 - uStack_19b8;
          }
          for (; 10.0 <= local_1a68; local_1a68 = local_1a68 / 10.0) {
            val._4_4_ = val._4_4_ + -1;
          }
          if (val._4_4_ < (int)base._4_4_) {
            base._4_4_ = val._4_4_ - 1;
          }
          if ((int)base._4_4_ < 0) {
            base._4_4_ = 0;
          }
          iVar4 = curl_msnprintf((char *)left,sStack_1a48,".%d",(ulong)base._4_4_);
          left = left + (long)iVar4;
        }
        if ((str._4_4_ & 0x20) != 0) {
          *(undefined1 *)left = 0x6c;
          left = left + 1;
        }
        if ((str._4_4_ & 0x40000) == 0) {
          if ((str._4_4_ & 0x80000) == 0) {
            *(undefined1 *)left = 0x66;
          }
          else {
            uVar3 = 0x67;
            if ((str._4_4_ & 0x1000) != 0) {
              uVar3 = 0x47;
            }
            *(undefined1 *)left = uVar3;
          }
        }
        else {
          uVar3 = 0x65;
          if ((str._4_4_ & 0x1000) != 0) {
            uVar3 = 0x45;
          }
          *(undefined1 *)left = uVar3;
        }
        left = left + 1;
        *(undefined1 *)left = 0;
        snprintf((char *)&workend,0x146,(char *)&fptr,*(undefined8 *)(input + uVar7));
        for (left = (size_t)&workend; *(char *)left != '\0'; left = left + 1) {
          iVar4 = (*stream)(*(uchar *)left,userp);
          if (iVar4 != 0) {
            return ocount;
          }
          ocount = ocount + 1;
        }
      }
switchD_001661d2_default:
    }
    userp_local._4_4_ = ocount;
  }
  else {
    userp_local._4_4_ = 0;
  }
  return userp_local._4_4_;
}

Assistant:

static int formatf(
  void *userp, /* untouched by format(), just sent to the stream() function in
                  the second argument */
  /* function pointer called for each output character */
  int (*stream)(unsigned char, void *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  static const char nilstr[] = "(nil)";
  const char *digits = lower_digits;   /* Base-36 digits for numbers.  */
  int done = 0;   /* number of characters written  */
  int i;
  int ocount = 0; /* number of output segments */
  int icount = 0; /* number of input arguments */

  struct outsegment output[MAX_SEGMENTS];
  struct va_input input[MAX_PARAMETERS];
  char work[BUFFSIZE + 2];

  /* 'workend' points to the final buffer byte position, but with an extra
     byte as margin to avoid the (FALSE?) warning Coverity gives us
     otherwise */
  char *workend = &work[BUFFSIZE - 2];

  /* Parse the format string */
  if(parsefmt(format, output, input, &ocount, &icount, ap_save))
    return 0;

  for(i = 0; i < ocount; i++) {
    struct outsegment *optr = &output[i];
    struct va_input *iptr;
    bool is_alt;            /* Format spec modifiers.  */
    int width;              /* Width of a field.  */
    int prec;               /* Precision of a field.  */
    bool is_neg;            /* Decimal integer is negative.  */
    unsigned long base;     /* Base of a number to be written.  */
    mp_uintmax_t num;       /* Integral values to be written.  */
    mp_intmax_t signed_num; /* Used to convert negative in positive.  */
    char *w;
    size_t outlen = optr->outlen;
    unsigned int flags = optr->flags;

    if(outlen) {
      const char *str = optr->start;
      for(; outlen && *str; outlen--)
        OUTCHAR(*str++);
      if(optr->flags & FLAGS_SUBSTR)
        /* this is just a substring */
        continue;
    }

    /* pick up the specified width */
    if(flags & FLAGS_WIDTHPARAM) {
      width = (int)input[optr->width].val.nums;
      if(width < 0) {
        /* "A negative field width is taken as a '-' flag followed by a
           positive field width." */
        if(width == INT_MIN)
          width = INT_MAX;
        else
          width = -width;
        flags |= FLAGS_LEFT;
        flags &= ~(unsigned int)FLAGS_PAD_NIL;
      }
    }
    else
      width = optr->width;

    /* pick up the specified precision */
    if(flags & FLAGS_PRECPARAM) {
      prec = (int)input[optr->precision].val.nums;
      if(prec < 0)
        /* "A negative precision is taken as if the precision were
           omitted." */
        prec = -1;
    }
    else if(flags & FLAGS_PREC)
      prec = optr->precision;
    else
      prec = -1;

    is_alt = (flags & FLAGS_ALT) ? 1 : 0;
    iptr = &input[optr->input];

    switch(iptr->type) {
    case FORMAT_INTU:
    case FORMAT_LONGU:
    case FORMAT_LONGLONGU:
      flags |= FLAGS_UNSIGNED;
      FALLTHROUGH();
    case FORMAT_INT:
    case FORMAT_LONG:
    case FORMAT_LONGLONG:
      num = iptr->val.numu;
      if(flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(flags & FLAGS_OCTAL) {
        /* Octal unsigned integer */
        base = 8;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer */
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        base = 16;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer */
        base = 10;
        is_neg = FALSE;
      }
      else {
        /* Decimal integer.  */
        base = 10;

        is_neg = (iptr->val.nums < (mp_intmax_t)0);
        if(is_neg) {
          /* signed_num might fail to hold absolute negative minimum by 1 */
          signed_num = iptr->val.nums + (mp_intmax_t)1;
          signed_num = -signed_num;
          num = (mp_uintmax_t)signed_num;
          num += (mp_uintmax_t)1;
        }
      }
number:
      /* Supply a default precision if none was given.  */
      if(prec == -1)
        prec = 1;

      /* Put the number in WORK.  */
      w = workend;
      switch(base) {
      case 10:
        while(num > 0) {
          *w-- = (char)('0' + (num % 10));
          num /= 10;
        }
        break;
      default:
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        break;
      }
      width -= (int)(workend - w);
      prec -= (int)(workend - w);

      if(is_alt && base == 8 && prec <= 0) {
        *w-- = '0';
        --width;
      }

      if(prec > 0) {
        width -= prec;
        while(prec-- > 0 && w >= work)
          *w-- = '0';
      }

      if(is_alt && base == 16)
        width -= 2;

      if(is_neg || (flags & FLAGS_SHOWSIGN) || (flags & FLAGS_SPACE))
        --width;

      if(!(flags & FLAGS_LEFT) && !(flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR(' ');

      if(is_neg)
        OUTCHAR('-');
      else if(flags & FLAGS_SHOWSIGN)
        OUTCHAR('+');
      else if(flags & FLAGS_SPACE)
        OUTCHAR(' ');

      if(is_alt && base == 16) {
        OUTCHAR('0');
        if(flags & FLAGS_UPPER)
          OUTCHAR('X');
        else
          OUTCHAR('x');
      }

      if(!(flags & FLAGS_LEFT) && (flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR('0');

      /* Write the number.  */
      while(++w <= workend) {
        OUTCHAR(*w);
      }

      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');
      break;

    case FORMAT_STRING: {
      const char *str;
      size_t len;

      str = iptr->val.str;
      if(!str) {
        /* Write null string if there is space.  */
        if(prec == -1 || prec >= (int) sizeof(nilstr) - 1) {
          str = nilstr;
          len = sizeof(nilstr) - 1;
          /* Disable quotes around (nil) */
          flags &= ~(unsigned int)FLAGS_ALT;
        }
        else {
          str = "";
          len = 0;
        }
      }
      else if(prec != -1)
        len = (size_t)prec;
      else if(*str == '\0')
        len = 0;
      else
        len = strlen(str);

      width -= (len > INT_MAX) ? INT_MAX : (int)len;

      if(flags & FLAGS_ALT)
        OUTCHAR('"');

      if(!(flags & FLAGS_LEFT))
        while(width-- > 0)
          OUTCHAR(' ');

      for(; len && *str; len--)
        OUTCHAR(*str++);
      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');

      if(flags & FLAGS_ALT)
        OUTCHAR('"');
      break;
    }

    case FORMAT_PTR:
      /* Generic pointer.  */
      if(iptr->val.ptr) {
        /* If the pointer is not NULL, write it as a %#x spec.  */
        base = 16;
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        is_alt = TRUE;
        num = (size_t) iptr->val.ptr;
        is_neg = FALSE;
        goto number;
      }
      else {
        /* Write "(nil)" for a nil pointer.  */
        const char *point;

        width -= (int)(sizeof(nilstr) - 1);
        if(flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
        for(point = nilstr; *point != '\0'; ++point)
          OUTCHAR(*point);
        if(!(flags & FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_DOUBLE: {
      char formatbuf[32]="%";
      char *fptr = &formatbuf[1];
      size_t left = sizeof(formatbuf)-strlen(formatbuf);
      int len;

      if(flags & FLAGS_WIDTH)
        width = optr->width;

      if(flags & FLAGS_PREC)
        prec = optr->precision;

      if(flags & FLAGS_LEFT)
        *fptr++ = '-';
      if(flags & FLAGS_SHOWSIGN)
        *fptr++ = '+';
      if(flags & FLAGS_SPACE)
        *fptr++ = ' ';
      if(flags & FLAGS_ALT)
        *fptr++ = '#';

      *fptr = 0;

      if(width >= 0) {
        size_t dlen;
        if(width >= BUFFSIZE)
          width = BUFFSIZE - 1;
        /* RECURSIVE USAGE */
        dlen = (size_t)curl_msnprintf(fptr, left, "%d", width);
        fptr += dlen;
        left -= dlen;
      }
      if(prec >= 0) {
        /* for each digit in the integer part, we can have one less
           precision */
        int maxprec = BUFFSIZE - 1;
        double val = iptr->val.dnum;
        if(prec > maxprec)
          prec = maxprec - 1;
        if(width > 0 && prec <= width)
          maxprec -= width;
        while(val >= 10.0) {
          val /= 10;
          maxprec--;
        }

        if(prec > maxprec)
          prec = maxprec - 1;
        if(prec < 0)
          prec = 0;
        /* RECURSIVE USAGE */
        len = curl_msnprintf(fptr, left, ".%d", prec);
        fptr += len;
      }
      if(flags & FLAGS_LONG)
        *fptr++ = 'l';

      if(flags & FLAGS_FLOATE)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'E' : 'e');
      else if(flags & FLAGS_FLOATG)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'G' : 'g');
      else
        *fptr++ = 'f';

      *fptr = 0; /* and a final null-termination */

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
      /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
         output characters */
#ifdef HAVE_SNPRINTF
      /* !checksrc! disable LONGLINE */
      /* NOLINTNEXTLINE(clang-analyzer-security.insecureAPI.DeprecatedOrUnsafeBufferHandling) */
      (snprintf)(work, BUFFSIZE, formatbuf, iptr->val.dnum);
#ifdef _WIN32
      /* Old versions of the Windows CRT do not terminate the snprintf output
         buffer if it reaches the max size so we do that here. */
      work[BUFFSIZE - 1] = 0;
#endif
#else
      (sprintf)(work, formatbuf, iptr->val.dnum);
#endif
#ifdef __clang__
#pragma clang diagnostic pop
#endif
      DEBUGASSERT(strlen(work) < BUFFSIZE);
      for(fptr = work; *fptr; fptr++)
        OUTCHAR(*fptr);
      break;
    }

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) iptr->val.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(flags & FLAGS_LONG)
          *(long *) iptr->val.ptr = (long)done;
      else if(!(flags & FLAGS_SHORT))
        *(int *) iptr->val.ptr = (int)done;
      else
        *(short *) iptr->val.ptr = (short)done;
      break;

    default:
      break;
    }
  }
  return done;
}